

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.h
# Opt level: O2

DegreeTableEntry * __thiscall
ADS::DArray<ADS::DegreeTable<ADS::NodeDistancePairClass_*>::DegreeTableEntry_*>::add
          (DArray<ADS::DegreeTable<ADS::NodeDistancePairClass_*>::DegreeTableEntry_*> *this,
          uint uiIndex,DegreeTableEntry *element)

{
  bool bVar1;
  DegreeTableEntry *pDVar2;
  uint uVar3;
  
  bVar1 = checkBound(this,uiIndex - this->_uiOff);
  if (bVar1) {
    uVar3 = uiIndex - this->_uiOff;
    pDVar2 = this->_pDArray[uVar3];
    this->_pDArray[uVar3] = element;
  }
  else {
    pDVar2 = (DegreeTableEntry *)0x0;
  }
  return pDVar2;
}

Assistant:

T
    DArray<T>::add (unsigned int uiIndex, T element)
    {
        if (!checkBound (shiftIndex (uiIndex)))
            return NULL;
        T tmp = _pDArray[shiftIndex (uiIndex)];
        _pDArray[shiftIndex (uiIndex)] = element;
        return tmp;
    }